

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O0

bool FileCommit(FILE *file)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  FILE *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_000000b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar5;
  int in_stack_ffffffffffffff7c;
  ConstevalFormatString<1U> in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = fflush(in_RDI);
  if (iVar2 == 0) {
    iVar2 = fileno(in_RDI);
    iVar2 = fdatasync(iVar2);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x16) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff20);
        __errno_location();
        SysErrorString_abi_cxx11_(in_stack_ffffffffffffff2c);
        uVar4 = 2;
        LogPrintFormatInternal<std::__cxx11::string>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffff7c,
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_000000b0,
                   in_stack_ffffffffffffffb8,in_stack_000000c0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff0c,uVar4));
        bVar5 = false;
        goto LAB_001a6b00;
      }
    }
    bVar5 = true;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    __errno_location();
    SysErrorString_abi_cxx11_(in_stack_ffffffffffffff2c);
    uVar4 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffff7c,
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_000000b0,
               in_stack_ffffffffffffffb8,in_stack_000000c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,uVar4));
    bVar5 = false;
  }
LAB_001a6b00:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool FileCommit(FILE* file)
{
    if (fflush(file) != 0) { // harmless if redundantly called
        LogPrintf("fflush failed: %s\n", SysErrorString(errno));
        return false;
    }
#ifdef WIN32
    HANDLE hFile = (HANDLE)_get_osfhandle(_fileno(file));
    if (FlushFileBuffers(hFile) == 0) {
        LogPrintf("FlushFileBuffers failed: %s\n", Win32ErrorString(GetLastError()));
        return false;
    }
#elif defined(MAC_OSX) && defined(F_FULLFSYNC)
    if (fcntl(fileno(file), F_FULLFSYNC, 0) == -1) { // Manpage says "value other than -1" is returned on success
        LogPrintf("fcntl F_FULLFSYNC failed: %s\n", SysErrorString(errno));
        return false;
    }
#elif HAVE_FDATASYNC
    if (fdatasync(fileno(file)) != 0 && errno != EINVAL) { // Ignore EINVAL for filesystems that don't support sync
        LogPrintf("fdatasync failed: %s\n", SysErrorString(errno));
        return false;
    }
#else
    if (fsync(fileno(file)) != 0 && errno != EINVAL) {
        LogPrintf("fsync failed: %s\n", SysErrorString(errno));
        return false;
    }
#endif
    return true;
}